

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O0

int deferReply(mpt_reply_context_detached *def,mpt_message *msg)

{
  int local_2c;
  int ret;
  replyDataDelayed *rd;
  mpt_message *msg_local;
  mpt_reply_context_detached *def_local;
  
  local_2c = contextSend((mpt_reply_context_defer *)def[1]._vptr,(mpt_reply_data *)(def + 2),msg);
  if (local_2c < 0) {
    if (msg != (mpt_message *)0x0) {
      return local_2c;
    }
    local_2c = 0;
  }
  contextDetach((mpt_reply_context_defer *)def[1]._vptr);
  free(def);
  return local_2c;
}

Assistant:

static int deferReply(MPT_STRUCT(reply_context_detached) *def, const MPT_STRUCT(message) *msg)
{
	struct replyDataDelayed *rd = (void *) def;
	int ret;
	if ((ret = contextSend(rd->base, &rd->data, msg)) < 0) {
		if (msg) {
			return ret;
		} else {
			ret = 0;
		}
	}
	contextDetach(rd->base);
	free(def);
	return ret;
}